

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_element.c
# Opt level: O1

apx_error_t
derive_hash_init_value(apx_dataElement_t *self,dtl_av_t *parsed_av,dtl_hv_t **derived_hv)

{
  char *pKey;
  bool bVar1;
  bool bVar2;
  int32_t iVar3;
  int32_t iVar4;
  apx_error_t aVar5;
  dtl_hv_t *self_00;
  void **ppvVar6;
  dtl_dv_t *parsed_value;
  apx_error_t aVar7;
  apx_dataElement_t *self_01;
  int s32Index;
  apx_dataElement_t *derived_element;
  dtl_dv_t *derived_dv;
  apx_dataElement_t *local_58;
  int local_4c;
  dtl_dv_t *local_48;
  dtl_hv_t **local_40;
  dtl_av_t *local_38;
  
  iVar3 = -1;
  if ((self != (apx_dataElement_t *)0x0) && (self->elements != (adt_ary_t *)0x0)) {
    iVar3 = adt_ary_length(self->elements);
  }
  self_00 = dtl_hv_new();
  if (self_00 == (dtl_hv_t *)0x0) {
    aVar7 = 2;
  }
  else {
    iVar4 = dtl_av_length(parsed_av);
    aVar7 = 0x46;
    if (iVar3 == iVar4) {
      bVar1 = 0 < iVar3;
      aVar7 = 0x46;
      local_40 = derived_hv;
      if (0 < iVar3) {
        s32Index = 0;
        local_4c = iVar3;
        local_38 = parsed_av;
        aVar7 = 0x46;
        do {
          local_58 = (apx_dataElement_t *)0x0;
          local_48 = (dtl_dv_t *)0x0;
          if (((self == (apx_dataElement_t *)0x0) || (self->elements == (adt_ary_t *)0x0)) ||
             (ppvVar6 = adt_ary_get(self->elements,s32Index), ppvVar6 == (void **)0x0)) {
            self_01 = (apx_dataElement_t *)0x0;
          }
          else {
            self_01 = (apx_dataElement_t *)*ppvVar6;
          }
          if (self_01 == (apx_dataElement_t *)0x0) {
            __assert_fail("child_element != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/data_element.c"
                          ,0x3cf,
                          "apx_error_t derive_hash_init_value(apx_dataElement_t *, dtl_av_t *, dtl_hv_t **)"
                         );
          }
          pKey = self_01->name;
          if (pKey == (char *)0x0) {
            __assert_fail("child_name != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/data_element.c"
                          ,0x3d1,
                          "apx_error_t derive_hash_init_value(apx_dataElement_t *, dtl_av_t *, dtl_hv_t **)"
                         );
          }
          aVar5 = apx_dataElement_derive_data_element(self_01,&local_58,(apx_dataElement_t **)0x0);
          if (aVar5 == 0) {
            if (local_58 == (apx_dataElement_t *)0x0) {
              __assert_fail("derived_element != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/data_element.c"
                            ,0x3d8,
                            "apx_error_t derive_hash_init_value(apx_dataElement_t *, dtl_av_t *, dtl_hv_t **)"
                           );
            }
            parsed_value = dtl_av_value(local_38,s32Index);
            aVar5 = apx_dataElement_derive_proper_init_value(local_58,parsed_value,&local_48);
            if (aVar5 != 0) {
              if (local_48 != (dtl_dv_t *)0x0) {
                __assert_fail("derived_dv == NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/data_element.c"
                              ,0x3dd,
                              "apx_error_t derive_hash_init_value(apx_dataElement_t *, dtl_av_t *, dtl_hv_t **)"
                             );
              }
              goto LAB_00127e5a;
            }
            dtl_hv_set_cstr(self_00,pKey,local_48,false);
            bVar2 = true;
          }
          else {
LAB_00127e5a:
            dtl_hv_delete(self_00);
            bVar2 = false;
            aVar7 = aVar5;
          }
          if (!bVar2) break;
          s32Index = s32Index + 1;
          bVar1 = s32Index < local_4c;
        } while (s32Index != local_4c);
      }
      if (!bVar1) {
        *local_40 = self_00;
        aVar7 = 0;
      }
    }
  }
  return aVar7;
}

Assistant:

static apx_error_t derive_hash_init_value(apx_dataElement_t* self, dtl_av_t* parsed_av, dtl_hv_t** derived_hv)
{
   dtl_hv_t* hv;
   int32_t num_children = apx_dataElement_get_num_child_elements(self);
   hv = dtl_hv_new();
   if (hv == NULL)
   {
      return APX_MEM_ERROR;
   }
   if (num_children != dtl_av_length(parsed_av))
   {
      return APX_VALUE_LENGTH_ERROR;
   }
   for (int32_t i = 0; i < num_children; i++)
   {
      apx_error_t result;
      apx_dataElement_t* derived_element = NULL;      
      dtl_dv_t* parsed_dv = NULL;
      dtl_dv_t* derived_dv = NULL;
      apx_dataElement_t* child_element = apx_dataElement_get_child_at(self, i);
      char const* child_name = NULL;
      assert(child_element != NULL);
      child_name = apx_dataElement_get_name(child_element);
      assert(child_name != NULL);
      result = apx_dataElement_derive_data_element(child_element, &derived_element, NULL);
      if (result != APX_NO_ERROR)
      {
         dtl_hv_delete(hv);
         return result;
      }
      assert(derived_element != NULL);
      parsed_dv = dtl_av_value(parsed_av, i);
      result = apx_dataElement_derive_proper_init_value(derived_element, parsed_dv, &derived_dv);
      if (result != APX_NO_ERROR)
      {
         assert(derived_dv == NULL);
         dtl_hv_delete(hv);
         return result;
      }      
      dtl_hv_set_cstr(hv, child_name, derived_dv, false);
   }
   *derived_hv = hv;
   return APX_NO_ERROR;
}